

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O0

reference __thiscall
absl::InlinedVector<s2shapeutil::ShapeEdge,_16UL,_std::allocator<s2shapeutil::ShapeEdge>_>::
GrowAndEmplaceBack<s2shapeutil::ShapeEdge>
          (InlinedVector<s2shapeutil::ShapeEdge,_16UL,_std::allocator<s2shapeutil::ShapeEdge>_>
           *this,ShapeEdge *args)

{
  Allocation new_allocation_00;
  size_type sVar1;
  size_type sVar2;
  allocator_type *a;
  pointer pSVar3;
  reference pSVar4;
  move_iterator<s2shapeutil::ShapeEdge_*> src;
  move_iterator<s2shapeutil::ShapeEdge_*> src_last;
  reference new_element;
  Allocation new_allocation;
  size_type s;
  ShapeEdge *args_local;
  InlinedVector<s2shapeutil::ShapeEdge,_16UL,_std::allocator<s2shapeutil::ShapeEdge>_> *this_local;
  
  sVar1 = size(this);
  sVar2 = capacity(this);
  if (sVar1 == sVar2) {
    new_allocation.buffer_ = (pointer)size(this);
    a = allocator(this);
    sVar1 = capacity(this);
    Allocation::Allocation((Allocation *)&new_element,a,sVar1 << 1);
    pSVar3 = Allocation::buffer((Allocation *)&new_element);
    pSVar4 = Construct<s2shapeutil::ShapeEdge>(this,pSVar3 + (long)new_allocation.buffer_,args);
    pSVar3 = data(this);
    src = std::make_move_iterator<s2shapeutil::ShapeEdge*>(pSVar3);
    pSVar3 = data(this);
    src_last = std::make_move_iterator<s2shapeutil::ShapeEdge*>
                         (pSVar3 + (long)new_allocation.buffer_);
    pSVar3 = Allocation::buffer((Allocation *)&new_element);
    InlinedVector<s2shapeutil::ShapeEdge,16ul,std::allocator<s2shapeutil::ShapeEdge>>::
    UninitializedCopy<std::move_iterator<s2shapeutil::ShapeEdge*>>
              ((InlinedVector<s2shapeutil::ShapeEdge,16ul,std::allocator<s2shapeutil::ShapeEdge>> *)
               this,src,src_last,pSVar3);
    new_allocation_00.buffer_ = (pointer)new_allocation.capacity_;
    new_allocation_00.capacity_ = (size_type)new_element;
    ResetAllocation(this,new_allocation_00,
                    (size_type)((long)&((new_allocation.buffer_)->id_).shape_id + 1));
    return pSVar4;
  }
  __assert_fail("size() == capacity()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/inlined_vector.h"
                ,0x327,
                "reference absl::InlinedVector<s2shapeutil::ShapeEdge, 16>::GrowAndEmplaceBack(Args &&...) [T = s2shapeutil::ShapeEdge, N = 16, A = std::allocator<s2shapeutil::ShapeEdge>, Args = <s2shapeutil::ShapeEdge>]"
               );
}

Assistant:

reference GrowAndEmplaceBack(Args&&... args) {
    assert(size() == capacity());
    const size_type s = size();

    Allocation new_allocation(allocator(), 2 * capacity());

    reference new_element =
        Construct(new_allocation.buffer() + s, std::forward<Args>(args)...);
    UninitializedCopy(std::make_move_iterator(data()),
                      std::make_move_iterator(data() + s),
                      new_allocation.buffer());

    ResetAllocation(new_allocation, s + 1);

    return new_element;
  }